

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

iterator * __thiscall
QPDFNameTreeObjectHelper::last(iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this)

{
  undefined1 local_80 [112];
  
  NNTreeImpl::last((iterator *)(local_80 + 0x10),
                   (((this->m).
                     super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
  std::make_shared<NNTreeIterator,NNTreeIterator>((NNTreeIterator *)local_80);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)(local_80 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::last() const
{
    return {std::make_shared<NNTreeIterator>(m->impl->last())};
}